

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_dup_i32_vec_tricore(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec r,TCGv_i32 a)

{
  uint uVar1;
  TCGOp *pTVar2;
  uintptr_t o_1;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_dup_vec);
  *(uint *)pTVar2 =
       (vece & 0xf) << 0xc | *(uint *)pTVar2 & 0xffff00ff | (uVar1 >> 8) + 0xe00 & 0xf00;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_dup_i32_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_i32 a)
{
    TCGArg ri = tcgv_vec_arg(tcg_ctx, r);
    TCGArg ai = tcgv_i32_arg(tcg_ctx, a);
    TCGTemp *rt = arg_temp(ri);
    TCGType type = rt->base_type;

    vec_gen_2(tcg_ctx, INDEX_op_dup_vec, type, vece, ri, ai);
}